

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O0

string * __thiscall
kratos::ExprOpStr_abi_cxx11_(string *__return_storage_ptr__,kratos *this,ExprOp op)

{
  runtime_error *this_00;
  allocator<char> local_43;
  allocator<char> local_42;
  allocator<char> local_41;
  allocator<char> local_40;
  allocator<char> local_3f;
  allocator<char> local_3e;
  allocator<char> local_3d;
  allocator<char> local_3c;
  allocator<char> local_3b;
  allocator<char> local_3a;
  allocator<char> local_39;
  allocator<char> local_38;
  allocator<char> local_37;
  allocator<char> local_36;
  allocator<char> local_35;
  allocator<char> local_34;
  allocator<char> local_33;
  allocator<char> local_32;
  allocator<char> local_31;
  allocator<char> local_30;
  allocator<char> local_2f;
  allocator<char> local_2e;
  allocator<char> local_2d [20];
  allocator<char> local_19;
  kratos *local_18;
  ExprOp op_local;
  
  local_18 = this;
  op_local = (ExprOp)__return_storage_ptr__;
  switch(this) {
  case (kratos *)0x0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"~",&local_19);
    std::allocator<char>::~allocator(&local_19);
    break;
  case (kratos *)0x1:
  case (kratos *)0x8:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"-",&local_2e);
    std::allocator<char>::~allocator(&local_2e);
    break;
  case (kratos *)0x2:
  case (kratos *)0x7:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"+",&local_2f);
    std::allocator<char>::~allocator(&local_2f);
    break;
  case (kratos *)0x3:
  case (kratos *)0xf:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"|",&local_36);
    std::allocator<char>::~allocator(&local_36);
    break;
  case (kratos *)0x4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"!",local_2d);
    std::allocator<char>::~allocator(local_2d);
    break;
  case (kratos *)0x5:
  case (kratos *)0x10:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"&",&local_37);
    std::allocator<char>::~allocator(&local_37);
    break;
  case (kratos *)0x6:
  case (kratos *)0x11:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"^",&local_38);
    std::allocator<char>::~allocator(&local_38);
    break;
  case (kratos *)0x9:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"/",&local_30);
    std::allocator<char>::~allocator(&local_30);
    break;
  case (kratos *)0xa:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"*",&local_31);
    std::allocator<char>::~allocator(&local_31);
    break;
  case (kratos *)0xb:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"%",&local_32);
    std::allocator<char>::~allocator(&local_32);
    break;
  case (kratos *)0xc:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,">>",&local_33);
    std::allocator<char>::~allocator(&local_33);
    break;
  case (kratos *)0xd:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,">>>",&local_34);
    std::allocator<char>::~allocator(&local_34);
    break;
  case (kratos *)0xe:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"<<",&local_35);
    std::allocator<char>::~allocator(&local_35);
    break;
  case (kratos *)0x12:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"**",&local_3f);
    std::allocator<char>::~allocator(&local_3f);
    break;
  case (kratos *)0x13:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"&&",&local_42);
    std::allocator<char>::~allocator(&local_42);
    break;
  case (kratos *)0x14:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"||",&local_43);
    std::allocator<char>::~allocator(&local_43);
    break;
  case (kratos *)0x15:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"<",&local_39);
    std::allocator<char>::~allocator(&local_39);
    break;
  case (kratos *)0x16:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,">",&local_3a);
    std::allocator<char>::~allocator(&local_3a);
    break;
  case (kratos *)0x17:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"<=",&local_3b);
    std::allocator<char>::~allocator(&local_3b);
    break;
  case (kratos *)0x18:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,">=",&local_3c);
    std::allocator<char>::~allocator(&local_3c);
    break;
  case (kratos *)0x19:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"==",&local_3d);
    std::allocator<char>::~allocator(&local_3d);
    break;
  case (kratos *)0x1a:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"!=",&local_3e);
    std::allocator<char>::~allocator(&local_3e);
    break;
  case (kratos *)0x1b:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,":",&local_40);
    std::allocator<char>::~allocator(&local_40);
    break;
  case (kratos *)0x1c:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,",",&local_41);
    std::allocator<char>::~allocator(&local_41);
    break;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"unable to find op");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ExprOpStr(ExprOp op) {
    switch (op) {
        case ExprOp::UInvert:
            return "~";
        case ExprOp::UNot:
            return "!";
        case ExprOp::UMinus:
        case ExprOp::Minus:
            return "-";
        case ExprOp::UPlus:
        case ExprOp::Add:
            return "+";
        case ExprOp::Divide:
            return "/";
        case ExprOp::Multiply:
            return "*";
        case ExprOp::Mod:
            return "%";
        case ExprOp::LogicalShiftRight:
            return ">>";
        case ExprOp::SignedShiftRight:
            return ">>>";
        case ExprOp::ShiftLeft:
            return "<<";
        case ExprOp::UOr:
        case ExprOp::Or:
            return "|";
        case ExprOp::UAnd:
        case ExprOp::And:
            return "&";
        case ExprOp::UXor:
        case ExprOp::Xor:
            return "^";
        case ExprOp::LessThan:
            return "<";
        case ExprOp::GreaterThan:
            return ">";
        case ExprOp::LessEqThan:
            return "<=";
        case ExprOp::GreaterEqThan:
            return ">=";
        case ExprOp::Eq:
            return "==";
        case ExprOp::Neq:
            return "!=";
        case ExprOp::Power:
            return "**";
        case ExprOp::Conditional:
            return ":";
        case ExprOp::Concat:
            return ",";
        case ExprOp::LAnd:
            return "&&";
        case ExprOp::LOr:
            return "||";
        default:
            throw std::runtime_error("unable to find op");
    }
}